

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_doomedmap.cpp
# Opt level: O0

void Cmd_dumpmapthings(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  hash_t max;
  uint uVar2;
  Pair **ppPVar3;
  char *pcVar4;
  uint local_5c;
  uint i;
  Pair *pair;
  undefined1 local_40 [8];
  Iterator it;
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  infos;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  max = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CountUsed
                  (&DoomEdMap);
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  ::TArray((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
            *)&it.Position,max);
  TMapIterator<int,_FDoomEdEntry,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>_>
  ::TMapIterator((TMapIterator<int,_FDoomEdEntry,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>_>
                  *)local_40,&DoomEdMap);
  while (bVar1 = TMapIterator<int,_FDoomEdEntry,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>_>
                 ::NextPair((TMapIterator<int,_FDoomEdEntry,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>_>
                             *)local_40,(Pair **)&stack0xffffffffffffffa8), bVar1) {
    TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
    ::Push((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
            *)&it.Position,(Pair **)&stack0xffffffffffffffa8);
  }
  uVar2 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
          ::Size((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                  *)&it.Position);
  if (uVar2 == 0) {
    Printf("No map things registered\n");
  }
  else {
    ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
              ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                            *)&it.Position,0);
    uVar2 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
            ::Size((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                    *)&it.Position);
    qsort(ppPVar3,(ulong)uVar2,8,sortnums);
    for (local_5c = 0;
        uVar2 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                ::Size((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                        *)&it.Position), local_5c < uVar2; local_5c = local_5c + 1) {
      ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                              *)&it.Position,(ulong)local_5c);
      if (((*ppPVar3)->Value).Type == (PClassActor *)0x0) {
        ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                  ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                                *)&it.Position,(ulong)local_5c);
        if (((*ppPVar3)->Value).Special < 1) {
          ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                    ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                                  *)&it.Position,(ulong)local_5c);
          Printf("%6d none\n",(ulong)(uint)(*ppPVar3)->Key);
        }
        else {
          ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                    ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                                  *)&it.Position,(ulong)local_5c);
          uVar2 = (*ppPVar3)->Key;
          ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                    ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                                  *)&it.Position,(ulong)local_5c);
          Printf("%6d %s\n",(ulong)uVar2,
                 *(undefined8 *)(&DAT_00a1ab08 + (long)((*ppPVar3)->Value).Special * 8));
        }
      }
      else {
        ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                  ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                                *)&it.Position,(ulong)local_5c);
        uVar2 = (*ppPVar3)->Key;
        ppPVar3 = TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                  ::operator[]((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
                                *)&it.Position,(ulong)local_5c);
        pcVar4 = FName::GetChars(&((((*ppPVar3)->Value).Type)->super_PClass).super_PNativeStruct.
                                  super_PStruct.super_PNamedType.TypeName);
        Printf("%6d %s\n",(ulong)uVar2,pcVar4);
      }
    }
  }
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  ::~TArray((TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
             *)&it.Position);
  return;
}

Assistant:

CCMD (dumpmapthings)
{
	TArray<FDoomEdMap::Pair*> infos(DoomEdMap.CountUsed());
	FDoomEdMap::Iterator it(DoomEdMap);
	FDoomEdMap::Pair *pair;

	while (it.NextPair(pair))
	{
		infos.Push(pair);
	}

	if (infos.Size () == 0)
	{
		Printf ("No map things registered\n");
	}
	else
	{
		qsort (&infos[0], infos.Size (), sizeof(FDoomEdMap::Pair*), sortnums);

		for (unsigned i = 0; i < infos.Size (); ++i)
		{
			if (infos[i]->Value.Type != NULL)
			{
				Printf("%6d %s\n", infos[i]->Key, infos[i]->Value.Type->TypeName.GetChars());
			}
			else if (infos[i]->Value.Special > 0)
			{
				Printf("%6d %s\n", infos[i]->Key, SpecialMapthingNames[infos[i]->Value.Special - 1]);
			}
			else
			{
				Printf("%6d none\n", infos[i]->Key);
			}

		}
	}
}